

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

uint add_to_class_internal
               (uint8_t *classbits,PCRE2_UCHAR16 **uchardptr,uint32_t options,compile_block_16 *cb,
               uint32_t start,uint32_t end)

{
  PCRE2_UCHAR16 *pPVar1;
  uint local_54;
  PCRE2_UCHAR16 *local_50;
  PCRE2_UCHAR16 *uchardata;
  uint n8;
  uint32_t classbits_end;
  uint32_t c;
  uint32_t end_local;
  uint32_t start_local;
  compile_block_16 *cb_local;
  uint32_t options_local;
  PCRE2_UCHAR16 **uchardptr_local;
  uint8_t *classbits_local;
  
  local_54 = end;
  if (0xff < end) {
    local_54 = 0xff;
  }
  uchardata._4_4_ = 0;
  n8 = start;
  if ((options & 8) != 0) {
    for (; n8 <= local_54; n8 = n8 + 1) {
      classbits[(int)(cb->fcc[n8] / 8)] =
           classbits[(int)(cb->fcc[n8] / 8)] | (byte)(1 << (cb->fcc[n8] & 7));
      uchardata._4_4_ = uchardata._4_4_ + 1;
    }
  }
  classbits_end = end;
  if (((options & 0x80000) == 0) && (0xffff < end)) {
    classbits_end = 0xffff;
  }
  n8 = start;
  if ((cb->class_range_start < start) && (classbits_end < cb->class_range_end)) {
    classbits_local._4_4_ = uchardata._4_4_;
  }
  else {
    for (; n8 <= local_54; n8 = n8 + 1) {
      classbits[n8 >> 3] = classbits[n8 >> 3] | (byte)(1 << ((byte)n8 & 7));
      uchardata._4_4_ = uchardata._4_4_ + 1;
    }
    c = start;
    if (start < 0x100) {
      c = 0x100;
    }
    if (c <= classbits_end) {
      local_50 = *uchardptr;
      if (c < classbits_end) {
        *local_50 = 2;
        pPVar1 = local_50 + 2;
        local_50[1] = (PCRE2_UCHAR16)c;
        local_50 = local_50 + 3;
        *pPVar1 = (PCRE2_UCHAR16)classbits_end;
      }
      else if (c == classbits_end) {
        pPVar1 = local_50 + 1;
        *local_50 = 1;
        local_50 = local_50 + 2;
        *pPVar1 = (PCRE2_UCHAR16)c;
      }
      *uchardptr = local_50;
    }
    classbits_local._4_4_ = uchardata._4_4_;
  }
  return classbits_local._4_4_;
}

Assistant:

static unsigned int
add_to_class_internal(uint8_t *classbits, PCRE2_UCHAR **uchardptr,
  uint32_t options, compile_block *cb, uint32_t start, uint32_t end)
{
uint32_t c;
uint32_t classbits_end = (end <= 0xff ? end : 0xff);
unsigned int n8 = 0;

/* If caseless matching is required, scan the range and process alternate
cases. In Unicode, there are 8-bit characters that have alternate cases that
are greater than 255 and vice-versa. Sometimes we can just extend the original
range. */

if ((options & PCRE2_CASELESS) != 0)
  {
#ifdef SUPPORT_UNICODE
  if ((options & PCRE2_UTF) != 0)
    {
    int rc;
    uint32_t oc, od;

    options &= ~PCRE2_CASELESS;   /* Remove for recursive calls */
    c = start;

    while ((rc = get_othercase_range(&c, end, &oc, &od)) >= 0)
      {
      /* Handle a single character that has more than one other case. */

      if (rc > 0) n8 += add_list_to_class_internal(classbits, uchardptr, options, cb,
        PRIV(ucd_caseless_sets) + rc, oc);

      /* Do nothing if the other case range is within the original range. */

      else if (oc >= cb->class_range_start && od <= cb->class_range_end) continue;

      /* Extend the original range if there is overlap, noting that if oc < c, we
      can't have od > end because a subrange is always shorter than the basic
      range. Otherwise, use a recursive call to add the additional range. */

      else if (oc < start && od >= start - 1) start = oc; /* Extend downwards */
      else if (od > end && oc <= end + 1)
        {
        end = od;       /* Extend upwards */
        if (end > classbits_end) classbits_end = (end <= 0xff ? end : 0xff);
        }
      else n8 += add_to_class_internal(classbits, uchardptr, options, cb, oc, od);
      }
    }
  else
#endif  /* SUPPORT_UNICODE */

  /* Not UTF mode */

  for (c = start; c <= classbits_end; c++)
    {
    SETBIT(classbits, cb->fcc[c]);
    n8++;
    }
  }

/* Now handle the originally supplied range. Adjust the final value according
to the bit length - this means that the same lists of (e.g.) horizontal spaces
can be used in all cases. */

if ((options & PCRE2_UTF) == 0 && end > MAX_NON_UTF_CHAR)
  end = MAX_NON_UTF_CHAR;

if (start > cb->class_range_start && end < cb->class_range_end) return n8;

/* Use the bitmap for characters < 256. Otherwise use extra data.*/

for (c = start; c <= classbits_end; c++)
  {
  /* Regardless of start, c will always be <= 255. */
  SETBIT(classbits, c);
  n8++;
  }

#ifdef SUPPORT_WIDE_CHARS
if (start <= 0xff) start = 0xff + 1;

if (end >= start)
  {
  PCRE2_UCHAR *uchardata = *uchardptr;

#ifdef SUPPORT_UNICODE
  if ((options & PCRE2_UTF) != 0)
    {
    if (start < end)
      {
      *uchardata++ = XCL_RANGE;
      uchardata += PRIV(ord2utf)(start, uchardata);
      uchardata += PRIV(ord2utf)(end, uchardata);
      }
    else if (start == end)
      {
      *uchardata++ = XCL_SINGLE;
      uchardata += PRIV(ord2utf)(start, uchardata);
      }
    }
  else
#endif  /* SUPPORT_UNICODE */

  /* Without UTF support, character values are constrained by the bit length,
  and can only be > 256 for 16-bit and 32-bit libraries. */

#if PCRE2_CODE_UNIT_WIDTH == 8
    {}
#else
  if (start < end)
    {
    *uchardata++ = XCL_RANGE;
    *uchardata++ = start;
    *uchardata++ = end;
    }
  else if (start == end)
    {
    *uchardata++ = XCL_SINGLE;
    *uchardata++ = start;
    }
#endif  /* PCRE2_CODE_UNIT_WIDTH == 8 */
  *uchardptr = uchardata;   /* Updata extra data pointer */
  }
#else  /* SUPPORT_WIDE_CHARS */
  (void)uchardptr;          /* Avoid compiler warning */
#endif /* SUPPORT_WIDE_CHARS */

return n8;    /* Number of 8-bit characters */
}